

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase441::run(TestCase441 *this)

{
  undefined1 in_stack_00000020 [40];
  Builder root;
  undefined1 in_stack_00000090 [48];
  MallocMessageBuilder builder;
  StructBuilder local_1b8;
  Builder local_190 [5];
  PointerBuilder local_118;
  StructBuilder in_stack_ffffffffffffff10;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&stack0xffffffffffffff08,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(local_190,(MessageBuilder *)&stack0xffffffffffffff08);
  local_118.pointer = local_190[0].builder.pointer;
  local_118.segment = local_190[0].builder.segment;
  local_118.capTable = local_190[0].builder.capTable;
  PointerBuilder::getStruct(&local_1b8,&local_118,(StructSize)0x10000,(word *)0x0);
  initTestMessage((Builder)in_stack_ffffffffffffff10);
  StructBuilder::asReader(&local_1b8);
  checkTestMessage((Reader)in_stack_00000090);
  checkTestMessage((Builder)in_stack_00000020);
  StructBuilder::asReader(&local_1b8);
  checkTestMessage((Reader)in_stack_00000090);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&stack0xffffffffffffff08);
  return;
}

Assistant:

TEST(Encoding, BuildListDefaults) {
  MallocMessageBuilder builder;
  TestListDefaults::Builder root = builder.getRoot<TestListDefaults>();

  initTestMessage(root);
  checkTestMessage(root.asReader());
  checkTestMessage(root);
  checkTestMessage(root.asReader());
}